

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_sparse_bit_array.cpp
# Opt level: O0

void __thiscall
crnlib::sparse_bit_array::sparse_bit_array(sparse_bit_array *this,sparse_bit_array *other)

{
  uint32 **ppuVar1;
  uint32 *puVar2;
  uint local_1c;
  uint i;
  sparse_bit_array *other_local;
  sparse_bit_array *this_local;
  
  this->m_num_groups = other->m_num_groups;
  ppuVar1 = (uint32 **)crnlib_malloc((ulong)this->m_num_groups << 3);
  this->m_ppGroups = ppuVar1;
  if (this->m_ppGroups == (uint32 **)0x0) {
    crnlib_assert("m_ppGroups",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/FrozenStormInteractive[P]Crunch2/crnlib/crn_sparse_bit_array.cpp"
                  ,0x2e);
  }
  for (local_1c = 0; local_1c < this->m_num_groups; local_1c = local_1c + 1) {
    if (other->m_ppGroups[local_1c] == (uint32 *)0x0) {
      this->m_ppGroups[local_1c] = (uint32 *)0x0;
    }
    else {
      puVar2 = alloc_group(false);
      this->m_ppGroups[local_1c] = puVar2;
      memcpy(this->m_ppGroups[local_1c],other->m_ppGroups[local_1c],0x40);
    }
  }
  return;
}

Assistant:

sparse_bit_array::sparse_bit_array(sparse_bit_array& other)
    {
        m_num_groups = other.m_num_groups;
        m_ppGroups = (uint32**)crnlib_malloc(m_num_groups * sizeof(uint32*));
        CRNLIB_VERIFY(m_ppGroups);

        for (uint i = 0; i < m_num_groups; i++)
        {
            if (other.m_ppGroups[i])
            {
                m_ppGroups[i] = alloc_group(false);
                memcpy(m_ppGroups[i], other.m_ppGroups[i], cBytesPerGroup);
            }
            else
            {
                m_ppGroups[i] = nullptr;
            }
        }
    }